

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less *comp)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  xpath_allocator *pxVar4;
  xpath_memory_block *pxVar5;
  size_t sVar6;
  xpath_allocator *alloc;
  xpath_memory_block *pxVar7;
  size_t sVar8;
  xpath_memory_block *pxVar9;
  xpath_node *pxVar10;
  bool bVar11;
  xpath_node *pxVar12;
  xpath_allocator *pxVar13;
  xpath_memory_block *pxVar14;
  double dVar15;
  double dVar16;
  xpath_node_set_raw rs;
  xpath_node_set_raw ls;
  size_t local_b8;
  char_t *local_88;
  xpath_node *local_80;
  xpath_node *local_78;
  xpath_node_set_raw local_68;
  xpath_string local_48;
  
  cVar1 = lhs->_rettype;
  cVar2 = rhs->_rettype;
  if (cVar2 == '\x01' || cVar1 == '\x01') {
    if (cVar2 == '\x01' && cVar1 == '\x01') {
      pxVar13 = stack->result;
      pxVar14 = pxVar13->_root;
      sVar3 = pxVar13->_root_size;
      bVar11 = false;
      eval_node_set(&local_68,lhs,c,stack,nodeset_eval_all);
      eval_node_set((xpath_node_set_raw *)&local_88,rhs,c,stack,nodeset_eval_all);
      pxVar10 = local_68._begin;
      if (local_68._begin != local_68._end) {
        do {
          pxVar4 = stack->result;
          pxVar5 = pxVar4->_root;
          sVar6 = pxVar4->_root_size;
          string_value(&local_48,(anon_unknown_0 *)(pxVar10->_node)._root,
                       (xpath_node *)(pxVar10->_attribute)._attr,pxVar4);
          dVar15 = convert_string_to_number(local_48._buffer);
          pxVar12 = local_80;
          if (local_80 != local_78) {
LAB_0036fb4e:
            alloc = stack->result;
            pxVar7 = alloc->_root;
            sVar8 = alloc->_root_size;
            string_value(&local_48,(anon_unknown_0 *)(pxVar12->_node)._root,
                         (xpath_node *)(pxVar12->_attribute)._attr,alloc);
            dVar16 = convert_string_to_number(local_48._buffer);
            pxVar9 = alloc->_root;
            while (pxVar9 != pxVar7) {
              pxVar9 = pxVar9->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            alloc->_root = pxVar7;
            alloc->_root_size = sVar8;
            if (dVar16 <= dVar15) goto code_r0x0036fbba;
            pxVar7 = pxVar4->_root;
            while (pxVar7 != pxVar5) {
              pxVar7 = pxVar7->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            pxVar4->_root = pxVar5;
            pxVar4->_root_size = sVar6;
            bVar11 = true;
            goto LAB_0036fd4f;
          }
LAB_0036fbca:
          pxVar7 = pxVar4->_root;
          while (pxVar7 != pxVar5) {
            pxVar7 = pxVar7->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
          pxVar4->_root = pxVar5;
          pxVar4->_root_size = sVar6;
          pxVar10 = pxVar10 + 1;
        } while (pxVar10 != local_68._end);
        bVar11 = false;
      }
LAB_0036fd4f:
      pxVar5 = pxVar13->_root;
      while (pxVar5 != pxVar14) {
        pxVar5 = pxVar5->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
      pxVar13->_root = pxVar14;
      pxVar13->_root_size = sVar3;
    }
    else {
      if (cVar1 == '\x01' || cVar2 != '\x01') {
        if ((cVar1 != '\x01') || (cVar2 == '\x01')) {
          __assert_fail("false && \"Wrong types\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x26a5,
                        "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less]"
                       );
        }
        pxVar13 = stack->result;
        pxVar14 = pxVar13->_root;
        local_b8 = pxVar13->_root_size;
        bVar11 = false;
        eval_node_set(&local_68,lhs,c,stack,nodeset_eval_all);
        dVar15 = eval_number(rhs,c,stack);
        pxVar10 = local_68._begin;
        if (local_68._begin != local_68._end) {
          do {
            pxVar4 = stack->result;
            pxVar5 = pxVar4->_root;
            sVar3 = pxVar4->_root_size;
            string_value((xpath_string *)&local_88,(anon_unknown_0 *)(pxVar10->_node)._root,
                         (xpath_node *)(pxVar10->_attribute)._attr,pxVar4);
            dVar16 = convert_string_to_number(local_88);
            bVar11 = dVar16 < dVar15;
            pxVar7 = pxVar4->_root;
            while (pxVar7 != pxVar5) {
              pxVar7 = pxVar7->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            pxVar4->_root = pxVar5;
            pxVar4->_root_size = sVar3;
          } while ((dVar15 <= dVar16) && (pxVar10 = pxVar10 + 1, pxVar10 != local_68._end));
        }
        pxVar5 = pxVar13->_root;
        while (pxVar5 != pxVar14) {
          pxVar5 = pxVar5->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
      }
      else {
        pxVar13 = stack->result;
        pxVar14 = pxVar13->_root;
        local_b8 = pxVar13->_root_size;
        dVar15 = eval_number(lhs,c,stack);
        bVar11 = false;
        eval_node_set(&local_68,rhs,c,stack,nodeset_eval_all);
        pxVar10 = local_68._begin;
        if (local_68._begin != local_68._end) {
          do {
            pxVar4 = stack->result;
            pxVar5 = pxVar4->_root;
            sVar3 = pxVar4->_root_size;
            string_value((xpath_string *)&local_88,(anon_unknown_0 *)(pxVar10->_node)._root,
                         (xpath_node *)(pxVar10->_attribute)._attr,pxVar4);
            dVar16 = convert_string_to_number(local_88);
            bVar11 = dVar15 < dVar16;
            pxVar7 = pxVar4->_root;
            while (pxVar7 != pxVar5) {
              pxVar7 = pxVar7->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            pxVar4->_root = pxVar5;
            pxVar4->_root_size = sVar3;
          } while ((dVar16 <= dVar15) && (pxVar10 = pxVar10 + 1, pxVar10 != local_68._end));
        }
        pxVar5 = pxVar13->_root;
        while (pxVar5 != pxVar14) {
          pxVar5 = pxVar5->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
      }
      pxVar13->_root = pxVar14;
      pxVar13->_root_size = local_b8;
    }
  }
  else {
    dVar15 = eval_number(lhs,c,stack);
    dVar16 = eval_number(rhs,c,stack);
    bVar11 = dVar15 < dVar16;
  }
  return bVar11;
code_r0x0036fbba:
  pxVar12 = pxVar12 + 1;
  if (pxVar12 == local_78) goto LAB_0036fbca;
  goto LAB_0036fb4e;
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(false && "Wrong types"); // unreachable
				return false;
			}
		}